

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointAction::~IfcStructuralPointAction
          (IfcStructuralPointAction *this)

{
  undefined1 *puVar1;
  
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject =
       0x8b8b48;
  *(undefined8 *)&(this->super_IfcStructuralAction).field_0x188 = 0x8b8c38;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0x88 = 0x8b8b70;
  (this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x8b8b98;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.super_IfcObject.
    field_0xd0 = 0x8b8bc0;
  *(undefined8 *)
   &(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.field_0x100 =
       0x8b8be8;
  *(undefined8 *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.field_0x138 =
       0x8b8c10;
  puVar1 = *(undefined1 **)
            &(this->super_IfcStructuralAction).super_IfcStructuralActivity.field_0x148;
  if (puVar1 != &(this->super_IfcStructuralAction).field_0x158) {
    operator_delete(puVar1);
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)this,&PTR_construction_vtable_24__008b89b8);
  operator_delete(this);
  return;
}

Assistant:

IfcStructuralPointAction() : Object("IfcStructuralPointAction") {}